

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O0

int __thiscall
ExtraData::getVectorHeader(ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val)

{
  uint uVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  uint local_1c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  int len;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *val_local;
  ExtraData *this_local;
  
  pvStack_18 = val;
  val_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,val);
  uVar1 = Utils::lenFourBytes(&local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  local_1c = uVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"              VectorHeader:         ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"                 Length:            ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
  poVar2 = std::operator<<(poVar2," bytes. ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return local_1c;
}

Assistant:

int ExtraData::getVectorHeader(std::vector<unsigned int> val) {
    int len = Utils::lenFourBytes(val);
    cout << "              VectorHeader:         " << endl;
    cout << "                 Length:            " << dec << len << " bytes. " << endl;
    return len;
}